

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QLayoutItem * ownershipCleanedItem(QFormLayoutItem *item,QFormLayout *layout)

{
  int iVar1;
  undefined4 extraout_var;
  QObject *pQVar2;
  QObject *in_RSI;
  QFormLayoutItem *in_RDI;
  QLayout *l;
  QLayoutItem *i;
  QLayoutItem *local_8;
  
  if (in_RDI == (QFormLayoutItem *)0x0) {
    local_8 = (QLayoutItem *)0x0;
  }
  else {
    local_8 = in_RDI->item;
    in_RDI->item = (QLayoutItem *)0x0;
    if (in_RDI != (QFormLayoutItem *)0x0) {
      QFormLayoutItem::~QFormLayoutItem(in_RDI);
      operator_delete(in_RDI,0x40);
    }
    iVar1 = (*local_8->_vptr_QLayoutItem[0xe])();
    if (((QObject *)CONCAT44(extraout_var,iVar1) != (QObject *)0x0) &&
       (pQVar2 = QObject::parent((QObject *)0x4b6918), pQVar2 == in_RSI)) {
      QObject::setParent((QObject *)CONCAT44(extraout_var,iVar1));
    }
  }
  return local_8;
}

Assistant:

static QLayoutItem *ownershipCleanedItem(QFormLayoutItem *item, QFormLayout *layout)
{
    if (!item)
        return nullptr;

    // grab ownership back from the QFormLayoutItem
    QLayoutItem *i = item->item;
    item->item = nullptr;
    delete item;

    if (QLayout *l = i->layout()) {
        // sanity check in case the user passed something weird to QObject::setParent()
        if (l->parent() == layout)
            l->setParent(nullptr);
    }

    return i;
}